

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS ref_collapse_diagnostics(REF_GRID ref_grid)

{
  uint uVar1;
  int local_6c;
  int local_64;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL has_side;
  REF_DBL edge_ratio;
  REF_INT local_38;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_EDGE ref_edge;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_edge = (REF_EDGE)ref_grid->cell[3];
  ref_node = (REF_NODE)ref_grid;
  uVar1 = ref_edge_create((REF_EDGE *)&node0,ref_grid);
  if (uVar1 == 0) {
    for (node1 = 0; node1 < _node0->n; node1 = node1 + 1) {
      local_38 = _node0->e2n[node1 << 1];
      edge_ratio._4_4_ = _node0->e2n[node1 * 2 + 1];
      uVar1 = ref_node_ratio((REF_NODE)ref_cell,local_38,edge_ratio._4_4_,
                             (REF_DBL *)&ref_private_macro_code_rss);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x34,"ref_collapse_diagnostics",(ulong)uVar1,"ratio");
        return uVar1;
      }
      if (_ref_private_macro_code_rss < *(double *)(*(long *)&ref_node[1].blank + 0x58) + 0.1) {
        uVar1 = ref_cell_has_side((REF_CELL)ref_edge,local_38,edge_ratio._4_4_,
                                  &ref_private_macro_code_rss_1);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x36,"ref_collapse_diagnostics",(ulong)uVar1,"side");
          return uVar1;
        }
        if ((local_38 < 0) || (**(int **)(ref_edge + 2) <= local_38)) {
          local_64 = -1;
        }
        else {
          local_64 = *(int *)(*(long *)(*(long *)(ref_edge + 2) + 8) + (long)local_38 * 4);
        }
        if ((edge_ratio._4_4_ < 0) || (**(int **)(ref_edge + 2) <= edge_ratio._4_4_)) {
          local_6c = -1;
        }
        else {
          local_6c = *(int *)(*(long *)(*(long *)(ref_edge + 2) + 8) + (long)edge_ratio._4_4_ * 4);
        }
        printf("ratio %f bound nodes %d %d tri edge %d\n",_ref_private_macro_code_rss,
               (ulong)(local_64 != -1),(ulong)(local_6c != -1),
               (ulong)(uint)ref_private_macro_code_rss_1);
      }
    }
    ref_grid_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x30
           ,"ref_collapse_diagnostics",(ulong)uVar1,"orig edges");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_diagnostics(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, node0, node1;
  REF_DBL edge_ratio;
  REF_BOOL has_side;
  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    if (edge_ratio < 0.1 + ref_grid_adapt(ref_grid, post_min_ratio)) {
      RSS(ref_cell_has_side(ref_cell, node0, node1, &has_side), "side");
      printf("ratio %f bound nodes %d %d tri edge %d\n", edge_ratio,
             !ref_cell_node_empty(ref_cell, node0),
             !ref_cell_node_empty(ref_cell, node1), has_side);
    }
  }

  return REF_SUCCESS;
}